

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_write_string(FILE *f,char *str,char *errmsg)

{
  size_t sVar1;
  
  sVar1 = strlen(str);
  if (sVar1 < 0xffffffff) {
    mcpl_write_buffer(f,(uint32_t)sVar1,str,errmsg);
    return;
  }
  (*mcpl_error_handler)("too large string encountered ");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_write_string(FILE* f, const char * str, const char * errmsg)
{
  size_t n = strlen(str);
  if ( n >= 4294967295 )
    mcpl_error("too large string encountered ");
  mcpl_write_buffer(f,(uint32_t)n,str,errmsg);//nb: we don't write the terminating null-char
}